

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O0

bool __thiscall cmWorkerPoolInternal::Process(cmWorkerPoolInternal *this)

{
  int iVar1;
  type puVar2;
  pointer loop;
  cmWorkerPoolInternal *__n;
  void *__buf;
  int in_R8D;
  bool success;
  cmWorkerPoolInternal *this_local;
  
  this->Processing = true;
  this->Aborting = false;
  puVar2 = std::unique_ptr<uv_loop_s,_std::default_delete<uv_loop_s>_>::operator*(&this->UVLoop);
  ::cm::uv_async_ptr::init(&this->UVRequestBegin,(EVP_PKEY_CTX *)puVar2);
  puVar2 = std::unique_ptr<uv_loop_s,_std::default_delete<uv_loop_s>_>::operator*(&this->UVLoop);
  __n = this;
  ::cm::uv_async_ptr::init(&this->UVRequestEnd,(EVP_PKEY_CTX *)puVar2);
  ::cm::uv_async_ptr::send(&this->UVRequestBegin,(int)puVar2,__buf,(size_t)__n,in_R8D);
  loop = std::unique_ptr<uv_loop_s,_std::default_delete<uv_loop_s>_>::get(&this->UVLoop);
  iVar1 = uv_run(loop,UV_RUN_DEFAULT);
  this->Processing = false;
  this->Aborting = false;
  return iVar1 == 0;
}

Assistant:

bool cmWorkerPoolInternal::Process()
{
  // Reset state flags
  Processing = true;
  Aborting = false;
  // Initialize libuv asynchronous request
  UVRequestBegin.init(*UVLoop, &cmWorkerPoolInternal::UVSlotBegin, this);
  UVRequestEnd.init(*UVLoop, &cmWorkerPoolInternal::UVSlotEnd, this);
  // Send begin request
  UVRequestBegin.send();
  // Run libuv loop
  bool success = (uv_run(UVLoop.get(), UV_RUN_DEFAULT) == 0);
  // Update state flags
  Processing = false;
  Aborting = false;
  return success;
}